

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

wchar_t assertion_text_file_contents(char *filename,wchar_t line,char *buff,char *fn)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  char *p;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  char cVar6;
  char cVar7;
  long lVar8;
  bool bVar9;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  __stream = fopen(fn,"r");
  if (__stream == (FILE *)0x0) {
    failure_start(filename,line,"File doesn\'t exist: %s",fn);
    failure_finish(filename);
    return L'\0';
  }
  sVar2 = strlen(buff);
  iVar1 = (int)sVar2;
  p = (char *)malloc((long)(iVar1 * 2 + 0x80));
  sVar2 = fread(p,1,(long)(iVar1 * 2 + 0x7f),__stream);
  uVar5 = (uint)sVar2;
  if (-1 < (int)uVar5) {
    p[uVar5 & 0x7fffffff] = '\0';
  }
  fclose(__stream);
  cVar6 = *buff;
  bVar9 = cVar6 == '\0';
  pcVar3 = p;
  if (!bVar9) {
    cVar7 = *p;
    if (cVar7 != '\0') {
      pcVar4 = buff + 1;
      do {
        lVar8 = 1;
        if ((cVar6 != cVar7) &&
           (((cVar6 != '\n' || (cVar7 != '\r')) || (lVar8 = 2, pcVar3[1] != '\n')))) break;
        pcVar3 = pcVar3 + lVar8;
        cVar6 = *pcVar4;
        bVar9 = cVar6 == '\0';
        if (bVar9) goto LAB_00103b2d;
        cVar7 = *pcVar3;
        pcVar4 = pcVar4 + 1;
      } while (cVar7 != '\0');
    }
    if (!bVar9) goto LAB_00103b32;
  }
LAB_00103b2d:
  if (*pcVar3 == '\0') {
    free(p);
    return L'\x01';
  }
LAB_00103b32:
  failure_start(filename,line,"Contents don\'t match");
  logprintf("  file=\"%s\"\n",fn);
  if ((int)uVar5 < 1) {
    pcVar4 = "  File empty, contents should be:\n";
    pcVar3 = (char *)0x0;
  }
  else {
    hexdump(p,buff,(ulong)(uVar5 & 0x7fffffff),0);
    pcVar4 = "  expected\n";
    pcVar3 = p;
  }
  logprintf(pcVar4);
  hexdump(buff,pcVar3,(long)iVar1,0);
  failure_finish(buff);
  free(p);
  return L'\0';
}

Assistant:

int
assertion_text_file_contents(const char *filename, int line, const char *buff, const char *fn)
{
	char *contents;
	const char *btxt, *ftxt;
	FILE *f;
	int n, s;

	assertion_count(filename, line);
	f = fopen(fn, "r");
	if (f == NULL) {
		failure_start(filename, line,
		    "File doesn't exist: %s", fn);
		failure_finish(NULL);
		return (0);
	}
	s = (int)strlen(buff);
	contents = malloc(s * 2 + 128);
	n = (int)fread(contents, 1, s * 2 + 128 - 1, f);
	if (n >= 0)
		contents[n] = '\0';
	fclose(f);
	/* Compare texts. */
	btxt = buff;
	ftxt = (const char *)contents;
	while (*btxt != '\0' && *ftxt != '\0') {
		if (*btxt == *ftxt) {
			++btxt;
			++ftxt;
			continue;
		}
		if (btxt[0] == '\n' && ftxt[0] == '\r' && ftxt[1] == '\n') {
			/* Pass over different new line characters. */
			++btxt;
			ftxt += 2;
			continue;
		}
		break;
	}
	if (*btxt == '\0' && *ftxt == '\0') {
		free(contents);
		return (1);
	}
	failure_start(filename, line, "Contents don't match");
	logprintf("  file=\"%s\"\n", fn);
	if (n > 0) {
		hexdump(contents, buff, n, 0);
		logprintf("  expected\n");
		hexdump(buff, contents, s, 0);
	} else {
		logprintf("  File empty, contents should be:\n");
		hexdump(buff, NULL, s, 0);
	}
	failure_finish(NULL);
	free(contents);
	return (0);
}